

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetF0CandidateFromRawEvent
               (double boundary_f0,double fs,fft_complex *y_spectrum,int y_length,int fft_size,
               double f0_floor,double f0_ceil,double *temporal_positions,int f0_length,
               double *f0_candidate)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *f0_floor_00;
  int in_EDX;
  undefined4 in_R8D;
  double in_R9;
  ZeroCrossings zero_crossings;
  double *filtered_signal;
  double *in_stack_00000188;
  int in_stack_00000194;
  fft_complex *in_stack_00000198;
  double in_stack_000001a0;
  int in_stack_000001ac;
  double in_stack_000001b0;
  undefined1 local_b0 [8];
  ZeroCrossings *in_stack_ffffffffffffff58;
  double in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  double *in_stack_ffffffffffffff70;
  ZeroCrossings *in_stack_ffffffffffffff80;
  double *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  double *in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc0;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_EDX;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  f0_floor_00 = operator_new__(uVar2);
  GetFilteredSignal(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,
                    in_stack_00000194,in_stack_00000188);
  memset(local_b0,0,0x60);
  GetFourZeroCrossingIntervals
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  GetF0CandidateContour
            ((ZeroCrossings *)CONCAT44(in_R8D,in_stack_ffffffffffffffc0),in_R9,(double)f0_floor_00,
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
             in_stack_ffffffffffffff90);
  DestroyZeroCrossings(in_stack_ffffffffffffff80);
  if (f0_floor_00 != (void *)0x0) {
    operator_delete__(f0_floor_00);
  }
  return;
}

Assistant:

static void GetF0CandidateFromRawEvent(double boundary_f0, double fs,
    const fft_complex *y_spectrum, int y_length, int fft_size, double f0_floor,
    double f0_ceil, const double *temporal_positions, int f0_length,
    double *f0_candidate) {
  double *filtered_signal = new double[fft_size];
  GetFilteredSignal(boundary_f0, fft_size, fs, y_spectrum,
      y_length, filtered_signal);

  ZeroCrossings zero_crossings = { 0 };
  GetFourZeroCrossingIntervals(filtered_signal, y_length, fs,
      &zero_crossings);

  GetF0CandidateContour(&zero_crossings, boundary_f0, f0_floor, f0_ceil,
      temporal_positions, f0_length, f0_candidate);

  DestroyZeroCrossings(&zero_crossings);
  delete[] filtered_signal;
}